

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

AddrOpndKind __thiscall IR::IndirOpnd::GetAddrKind(IndirOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  AddrOpndKind AVar3;
  undefined4 *puVar4;
  
  AVar3 = this->m_addrKind;
  if (AVar3 == ~AddrOpndKindConstantAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0xb07,"(HasAddrKind())","HasAddrKind()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    AVar3 = this->m_addrKind;
  }
  return AVar3;
}

Assistant:

IR::AddrOpndKind
IndirOpnd::GetAddrKind() const
{
    Assert(HasAddrKind());
#if DBG_DUMP
    return m_addrKind;
#else
    return IR::AddrOpndKindDynamicMisc;
#endif
}